

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolyEdgesTestGroup::init
          (PolyEdgesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  char *pcVar3;
  long lVar4;
  string local_1f8;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  int local_18c;
  undefined1 local_185;
  int ndx_1;
  string local_178;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  undefined1 local_f8 [4];
  int ndx;
  EdgeQuad edgeQuads [3];
  Quad quads [5];
  PolyEdgesTestGroup *this_local;
  
  quads[4].d2.m_data._4_8_ = this;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[2].center.m_data + 2),1.0,1.0,1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[0].d1.m_data + 1),1.0,-1.0,1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[0].d2.m_data + 1),1.0,1.0,1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[1].d1.m_data + 1),-1.0,1.1,1.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[1].d2.m_data + 1),1.0,1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[2].d1.m_data + 1),-1.0,1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[2].d2.m_data + 1),0.0,1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[3].d1.m_data + 1),1.0,0.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[3].d2.m_data + 1),0.0,1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(quads[4].d1.m_data + 1),1.0,0.1,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_f8,1.0,0.01,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[0].d1.m_data + 1),0.0,0.01,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[0].d2.m_data + 1),0.0,0.99,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[0].center.m_data + 1),0.01,1.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[1].d1.m_data + 1),0.01,0.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[1].d2.m_data + 1),0.99,0.0,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[1].center.m_data + 1),1.0,1.0,0.01);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[2].d1.m_data + 1),0.01,-0.01,0.0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(edgeQuads[2].d2.m_data + 1),0.0,0.0,0.99);
  for (local_fc = 0; local_fc < 5; local_fc = local_fc + 1) {
    pTVar2 = (TestNode *)operator_new(0xa0);
    local_185 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"quad_at_origin_",&local_141);
    de::toString<int>(&local_178,&local_fc);
    std::operator+(&local_120,&local_140,&local_178);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    lVar4 = (long)local_fc;
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&ndx_1,0.0,0.0,0.0);
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar2,pCVar1,pcVar3,"polygon edge clipping",
               (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
               (Vec3 *)((&edgeQuads[2].center)[lVar4 * 2].m_data + 2),
               (Vec3 *)(quads[lVar4].d1.m_data + 1),(Vec3 *)&ndx_1);
    local_185 = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  for (local_18c = 0; local_18c < 3; local_18c = local_18c + 1) {
    pTVar2 = (TestNode *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"quad_near_edge_",&local_1d1);
    de::toString<int>(&local_1f8,&local_18c);
    std::operator+(&local_1b0,&local_1d0,&local_1f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    lVar4 = (long)local_18c;
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar2,pCVar1,pcVar3,"polygon edge clipping",
               (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER,
               (Vec3 *)(local_f8 + lVar4 * 0x24),(Vec3 *)(edgeQuads[lVar4].d1.m_data + 1),
               (Vec3 *)(edgeQuads[lVar4].d2.m_data + 1));
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  pTVar2 = (TestNode *)operator_new(0xa0);
  TriangleFanFillTest::TriangleFanFillTest
            ((TriangleFanFillTest *)pTVar2,(this->super_TestCaseGroup).m_context,"poly_fan",
             "polygon edge clipping",
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void PolyEdgesTestGroup::init (void)
{
	// Quads via origin
	const struct Quad
	{
		tcu::Vec3 d1; // tangent
		tcu::Vec3 d2; // bi-tangent
	} quads[] =
	{
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3( 1,   -1, 1) },
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3(-1, 1.1f, 1) },
		{ tcu::Vec3( 1, 1, 0),	tcu::Vec3(-1,    1, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1,    0, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1, 0.1f, 0) },
	};

	// Quad near edge
	const struct EdgeQuad
	{
		tcu::Vec3 d1;		// tangent
		tcu::Vec3 d2;		// bi-tangent
		tcu::Vec3 center;	// center
	} edgeQuads[] =
	{
		{ tcu::Vec3( 1,     0.01f, 0    ),	tcu::Vec3( 0,      0.01f,  0),  tcu::Vec3( 0,     0.99f, 0    ) }, // edge near x-plane
		{ tcu::Vec3( 0.01f, 1,     0    ),	tcu::Vec3( 0.01f,  0,      0),  tcu::Vec3( 0.99f, 0,     0    ) }, // edge near y-plane
		{ tcu::Vec3( 1,     1,     0.01f),	tcu::Vec3( 0.01f,  -0.01f, 0),  tcu::Vec3( 0,     0,     0.99f) }, // edge near z-plane
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_at_origin_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, quads[ndx].d1, quads[ndx].d2));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(edgeQuads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_near_edge_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, edgeQuads[ndx].d1, edgeQuads[ndx].d2, edgeQuads[ndx].center));

	// Polyfan
	addChild(new TriangleFanFillTest(m_context, "poly_fan", "polygon edge clipping", VIEWPORT_CENTER));
}